

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O2

btree_result
btree_init_from_bid(btree *btree,void *blk_handle,btree_blk_ops *blk_ops,btree_kv_ops *kv_ops,
                   uint32_t nodesize,bid_t root_bid)

{
  ushort uVar1;
  voidref addr;
  bnode *pbVar2;
  
  btree->blk_ops = blk_ops;
  btree->blk_handle = blk_handle;
  btree->kv_ops = kv_ops;
  btree->blksize = nodesize;
  btree->root_bid = root_bid;
  addr = (*blk_ops->blk_read)(blk_handle,root_bid);
  pbVar2 = _fetch_bnode(btree,addr,0);
  btree->root_flag = pbVar2->flag;
  btree->height = pbVar2->level;
  uVar1 = pbVar2->kvsize << 8 | pbVar2->kvsize >> 8;
  btree->ksize = (char)uVar1;
  btree->vsize = (char)(uVar1 >> 8);
  return BTREE_RESULT_SUCCESS;
}

Assistant:

btree_result btree_init_from_bid(struct btree *btree, void *blk_handle,
                                 struct btree_blk_ops *blk_ops,
                                 struct btree_kv_ops *kv_ops,
                                 uint32_t nodesize, bid_t root_bid)
{
    void *addr;
    struct bnode *root;

    btree->blk_ops = blk_ops;
    btree->blk_handle = blk_handle;
    btree->kv_ops = kv_ops;
    btree->blksize = nodesize;
    btree->root_bid = root_bid;

    addr = btree->blk_ops->blk_read(btree->blk_handle, btree->root_bid);
    root = _fetch_bnode(btree, addr, 0);

    btree->root_flag = root->flag;
    btree->height = root->level;
    _get_kvsize(root->kvsize, btree->ksize, btree->vsize);

    return BTREE_RESULT_SUCCESS;
}